

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNet.cpp
# Opt level: O0

int __thiscall PyreNet::NeuralNet::getOutputSize(NeuralNet *this)

{
  int iVar1;
  size_type sVar2;
  InvalidNetworkSize *this_00;
  reference this_01;
  NeuralNet *this_local;
  
  sVar2 = std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::size(&this->layers);
  if ((2 < sVar2) && (this->inputSize != 0)) {
    this_01 = std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::back(&this->layers);
    iVar1 = Layer::size(this_01);
    return iVar1;
  }
  this_00 = (InvalidNetworkSize *)__cxa_allocate_exception(8);
  memset(this_00,0,8);
  InvalidNetworkSize::InvalidNetworkSize(this_00);
  __cxa_throw(this_00,&InvalidNetworkSize::typeinfo,InvalidNetworkSize::~InvalidNetworkSize);
}

Assistant:

const int NeuralNet::getOutputSize() {
        if (this->layers.size() < 3 || this->inputSize == 0) throw InvalidNetworkSize();
        return this->layers.back().size();
    }